

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_392279::MLKEMTest_KeyGen1024TestVectors_Test::
~MLKEMTest_KeyGen1024TestVectors_Test(MLKEMTest_KeyGen1024TestVectors_Test *this)

{
  MLKEMTest_KeyGen1024TestVectors_Test *this_local;
  
  ~MLKEMTest_KeyGen1024TestVectors_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MLKEMTest, KeyGen1024TestVectors) {
  FileTestGTest(
      "crypto/mlkem/mlkem1024_keygen_tests.txt",
      MLKEMKeyGenFileTest<MLKEM1024_public_key, MLKEM1024_PUBLIC_KEY_BYTES,
                          MLKEM1024_private_key,
                          wrapper_1024_marshal_private_key,
                          wrapper_1024_generate_key_external_seed>);
}